

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O2

unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> __thiscall
duckdb::TemporaryFileManager::ReadTemporaryBuffer
          (TemporaryFileManager *this,block_id_t id,
          unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true>
          *reusable_buffer)

{
  long *plVar1;
  TemporaryFileIndex index_00;
  TemporaryFileHandle *pTVar2;
  unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *reusable_buffer_00;
  long *in_RCX;
  TemporaryFileManagerLock *extraout_RDX;
  TemporaryFileManagerLock lock;
  TemporaryFileManagerLock lock_1;
  TemporaryFileIndex index;
  TemporaryFileManagerLock local_70;
  TemporaryFileIndex local_68;
  optional_ptr<duckdb::TemporaryFileHandle,_true> local_50;
  TemporaryFileIndex local_48;
  
  TemporaryFileIndex::TemporaryFileIndex(&local_48);
  TemporaryFileManagerLock::TemporaryFileManagerLock(&local_70,(mutex *)(id + 0x28));
  GetTempBlockIndex(&local_68,(TemporaryFileManager *)id,extraout_RDX,(block_id_t)reusable_buffer);
  local_48.block_index.index = local_68.block_index.index;
  local_48.identifier.size = local_68.identifier.size;
  local_48.identifier.file_index.index = local_68.identifier.file_index.index;
  local_50 = TemporaryFileMap::GetFile((TemporaryFileMap *)(id + 0x50),&local_48.identifier);
  pthread_mutex_unlock((pthread_mutex_t *)local_70.lock._M_device);
  pTVar2 = optional_ptr<duckdb::TemporaryFileHandle,_true>::operator->(&local_50);
  reusable_buffer_00 =
       (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>,_true> *)
       optional_idx::GetIndex(&local_48.block_index);
  plVar1 = (long *)*in_RCX;
  *in_RCX = 0;
  TemporaryFileHandle::ReadTemporaryBuffer
            ((TemporaryFileHandle *)this,(idx_t)pTVar2,reusable_buffer_00);
  if (plVar1 != (long *)0x0) {
    (**(code **)(*plVar1 + 8))();
  }
  TemporaryFileManagerLock::TemporaryFileManagerLock
            ((TemporaryFileManagerLock *)&local_68,(mutex *)(id + 0x28));
  pTVar2 = optional_ptr<duckdb::TemporaryFileHandle,_true>::operator*(&local_50);
  index_00.identifier.file_index.index = local_48.identifier.file_index.index;
  index_00.identifier.size = local_48.identifier.size;
  index_00.block_index.index = local_48.block_index.index;
  EraseUsedBlock((TemporaryFileManager *)id,(TemporaryFileManagerLock *)&local_68,
                 (block_id_t)reusable_buffer,pTVar2,index_00);
  pthread_mutex_unlock((pthread_mutex_t *)local_68.identifier.size);
  return (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>)
         (unique_ptr<duckdb::FileBuffer,_std::default_delete<duckdb::FileBuffer>_>)this;
}

Assistant:

unique_ptr<FileBuffer> TemporaryFileManager::ReadTemporaryBuffer(block_id_t id,
                                                                 unique_ptr<FileBuffer> reusable_buffer) {
	TemporaryFileIndex index;
	optional_ptr<TemporaryFileHandle> handle;
	{
		TemporaryFileManagerLock lock(manager_lock);
		index = GetTempBlockIndex(lock, id);
		handle = GetFileHandle(lock, index.identifier);
	}

	auto buffer = handle->ReadTemporaryBuffer(index.block_index.GetIndex(), std::move(reusable_buffer));
	{
		// remove the block (and potentially erase the temp file)
		TemporaryFileManagerLock lock(manager_lock);
		EraseUsedBlock(lock, id, *handle, index);
	}
	return buffer;
}